

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall
crnlib::dynamic_string::format_args(dynamic_string *this,char *p,__va_list_tag *args)

{
  bool bVar1;
  uint len;
  char local_1028 [4];
  int l;
  char buf [4096];
  uint cBufSize;
  __va_list_tag *args_local;
  char *p_local;
  dynamic_string *this_local;
  
  buf[0xffc] = '\0';
  buf[0xffd] = '\x10';
  buf[0xffe] = '\0';
  buf[0xfff] = '\0';
  len = vsnprintf(local_1028,0x1000,p,args);
  if ((int)len < 1) {
    clear(this);
  }
  else {
    bVar1 = ensure_buf(this,len,false);
    if (bVar1) {
      memcpy(this->m_pStr,local_1028,(long)(int)(len + 1));
      this->m_len = (uint16)len;
      check(this);
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::format_args(const char* p, va_list args)
    {
        CRNLIB_ASSERT(p);

        const uint cBufSize = 4096;
        char buf[cBufSize];

#if defined(CRN_CC_MSVC)
        int l = vsnprintf_s(buf, cBufSize, _TRUNCATE, p, args);
#else
        int l = vsnprintf(buf, cBufSize, p, args);
#endif
        if (l <= 0)
        {
            clear();
        }
        else if (ensure_buf(l, false))
        {
            memcpy(m_pStr, buf, l + 1);

            m_len = static_cast<uint16>(l);

            check();
        }

        return *this;
    }